

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

DdNode * Abc_NodeCollapseFunc
                   (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                   int *pPermFanout)

{
  DdManager *dd;
  ulong uVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  DdNode *n_00;
  int i;
  ulong unaff_RBX;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  i = (int)unaff_RBX;
  uVar6 = (ulong)(pFanout->vFanins).nSize;
  iVar2 = 0;
  bVar7 = false;
  if (0 < (long)uVar6) {
    uVar5 = 0;
    do {
      bVar7 = (Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[uVar5]] == pFanin;
      uVar1 = unaff_RBX;
      if (bVar7) {
        uVar1 = uVar5;
      }
      unaff_RBX = uVar1 & 0xffffffff;
      i = (int)uVar1;
      iVar2 = iVar2 + (uint)bVar7;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    bVar7 = iVar2 == 1;
  }
  if (bVar7) {
    dd = (DdManager *)pFanin->pNtk->pManFunc;
    iVar2 = Abc_NodeCollapseSuppSize(pFanin,pFanout,vFanins);
    Cudd_bddIthVar(dd,iVar2 + -1);
    if (dd->size < iVar2) {
      __assert_fail("nSize <= dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x181,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iVar2 = Abc_NodeCollapsePermMap(pFanin,(Abc_Obj_t *)0x0,vFanins,pPermFanin);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x184,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iVar2 = Abc_NodeCollapsePermMap(pFanout,pFanin,vFanins,pPermFanout);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x186,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    pDVar3 = Cudd_bddIthVar(dd,i);
    pDVar4 = Cudd_Cofactor(dd,(DdNode *)(pFanout->field_5).pData,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar4);
    pDVar3 = Cudd_Cofactor(dd,(DdNode *)(pFanout->field_5).pData,pDVar3);
    Cudd_Ref(pDVar3);
    n = Cudd_bddPermute(dd,pDVar4,pPermFanout);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar4 = Cudd_bddPermute(dd,pDVar3,pPermFanout);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,pDVar3);
    n_00 = Cudd_bddPermute(dd,(DdNode *)(pFanin->field_5).pData,pPermFanin);
    Cudd_Ref(n_00);
    pDVar3 = Cudd_bddIte(dd,n_00,pDVar4,n);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,pDVar4);
    Cudd_RecursiveDeref(dd,n);
    Cudd_Deref(pDVar3);
  }
  else {
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

DdNode * Abc_NodeCollapseFunc( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    DdManager * dd = (DdManager *)pFanin->pNtk->pManFunc;
    DdNode * bVar, * bFunc0, * bFunc1, * bTemp, * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    bVar = Cudd_bddIthVar( dd, nSize - 1 );
    assert( nSize <= dd->size );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // cofactor the local function of the node
    bVar   = Cudd_bddIthVar( dd, iFanin );
    bFunc0 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, Cudd_Not(bVar) ); Cudd_Ref( bFunc0 );
    bFunc1 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, bVar );           Cudd_Ref( bFunc1 );
    // find the permutation after collapsing
    bFunc0 = Cudd_bddPermute( dd, bTemp = bFunc0, pPermFanout );  Cudd_Ref( bFunc0 );
    Cudd_RecursiveDeref( dd, bTemp ); 
    bFunc1 = Cudd_bddPermute( dd, bTemp = bFunc1, pPermFanout );  Cudd_Ref( bFunc1 );
    Cudd_RecursiveDeref( dd, bTemp );
    bFanin = Cudd_bddPermute( dd, (DdNode *)pFanin->pData, pPermFanin );    Cudd_Ref( bFanin );
    // create the new function
    bFanout = Cudd_bddIte( dd, bFanin, bFunc1, bFunc0 );          Cudd_Ref( bFanout );
    Cudd_RecursiveDeref( dd, bFanin );
    Cudd_RecursiveDeref( dd, bFunc1 );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_Deref( bFanout );
    return bFanout;
}